

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

void __thiscall cmMakefile::PopLoopBlockBarrier(cmMakefile *this)

{
  bool bVar1;
  reference pvVar2;
  cmMakefile *this_local;
  
  bVar1 = std::stack<int,_std::deque<int,_std::allocator<int>_>_>::empty(&this->LoopBlockCounter);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!this->LoopBlockCounter.empty()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmMakefile.cxx"
                  ,0xccc,"void cmMakefile::PopLoopBlockBarrier()");
  }
  pvVar2 = std::stack<int,_std::deque<int,_std::allocator<int>_>_>::top(&this->LoopBlockCounter);
  if (*pvVar2 == 0) {
    std::stack<int,_std::deque<int,_std::allocator<int>_>_>::pop(&this->LoopBlockCounter);
    return;
  }
  __assert_fail("this->LoopBlockCounter.top() == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmMakefile.cxx"
                ,0xccd,"void cmMakefile::PopLoopBlockBarrier()");
}

Assistant:

void cmMakefile::PopLoopBlockBarrier()
{
  assert(!this->LoopBlockCounter.empty());
  assert(this->LoopBlockCounter.top() == 0);
  this->LoopBlockCounter.pop();
}